

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O2

void __thiscall
wallet::walletload_tests::wallet_load_descriptors::test_method(wallet_load_descriptors *this)

{
  Chain *pCVar1;
  string message;
  MockableData records;
  MockableData records_00;
  MatchFn match;
  WalletDatabase *pWVar2;
  element_type *peVar3;
  readonly_property<bool> rVar4;
  readonly_property65 rVar5;
  DBErrors DVar6;
  CWallet *pCVar7;
  iterator pvVar8;
  iterator pvVar9;
  string *psVar10;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  const_string file;
  const_string file_00;
  const_string file_01;
  shared_ptr<Descriptor> descriptor_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  int32_t in_stack_fffffffffffffbd8;
  int32_t next_index;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 uVar11;
  check_type cVar14;
  lazy_ostream *assertion_descr;
  assertion_result *paVar12;
  undefined8 in_stack_fffffffffffffbe8;
  char *pcVar13;
  undefined8 in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffc00;
  _Manager_type in_stack_fffffffffffffc08;
  _Invoker_type in_stack_fffffffffffffc10;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  WalletDatabase *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  element_type *local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  bool found;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  WalletDatabase *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  shared_ptr<wallet::CWallet> wallet_1;
  char *local_280;
  element_type *local_278;
  shared_count sStack_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  pointer local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_240 [2];
  WalletBatch local_230;
  WalletDatabase *local_220;
  string local_218 [32];
  DebugLogHelper logHelper;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_1a8;
  string desc;
  WalletDescriptor wallet_descriptor;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffffbdc;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffffbd8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar14;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffbe8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffbf0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffbf8;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc00;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_68);
  pWVar2 = local_220;
  (*local_220->_vptr_WalletDatabase[0xe])(&local_230,local_220,0);
  local_230.m_database = pWVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logHelper,
             "trx(tpubD6NzVbkrYhZ4Y4S7m6Y5s9GD8FqEMBy56AGphZXuagajudVZEnYyBahZMgHNCTJc2at82YX6s8JiL1Lohu5A3v1Ur76qguNH4QVQ7qYrBQx/86\'/1\'/0\'/0/*)#8pn8tzdt"
             ,(allocator<char> *)&wallet_descriptor);
  std::make_shared<wallet::walletload_tests::DummyDescriptor,std::__cxx11::string&>(&desc);
  local_248 = desc._M_dataplus._M_p;
  a_Stack_240[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)desc._M_string_length;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  pvVar8 = (iterator)0x0;
  pvVar9 = (iterator)0x0;
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_248;
  WalletDescriptor::WalletDescriptor(&wallet_descriptor,descriptor,0,0,0,in_stack_fffffffffffffbd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_240);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&desc._M_string_length);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x30;
  file.m_begin = (iterator)&local_258;
  msg.m_end = pvVar9;
  msg.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
  desc.field_2._M_allocated_capacity = 0;
  desc.field_2._8_8_ = 0;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       WalletBatch::WriteDescriptor(&local_230,(uint256 *)&desc,&wallet_descriptor);
  local_278 = (element_type *)0x0;
  sStack_270.pi_ = (sp_counted_base *)0x0;
  local_2b8 = "batch.WriteDescriptor(uint256(), wallet_descriptor)";
  local_2b0 = "";
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011481f0;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2c0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_280._0_1_ = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_280,(lazy_ostream *)&wallet_1,1,0,WARN,_cVar14,
             (size_t)&local_2c8,0x30);
  boost::detail::shared_count::~shared_count(&sStack_270);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x31;
  file_00.m_begin = (iterator)&local_2d8;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e8,
             msg_00);
  desc.field_2._M_allocated_capacity = 0;
  desc.field_2._8_8_ = 0;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       WalletBatch::WriteActiveScriptPubKeyMan(&local_230,'\x04',(uint256 *)&desc,false);
  local_280 = (char *)CONCAT71(local_280._1_7_,
                               rVar5.super_readonly_property<bool>.super_class_property<bool>.value)
  ;
  local_278 = (element_type *)0x0;
  sStack_270.pi_ = (sp_counted_base *)0x0;
  local_2b8 = 
  "batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(OutputType::UNKNOWN), uint256(), false)";
  local_2b0 = "";
  assertion_descr = (lazy_ostream *)&wallet_1;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011481f0;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_280,assertion_descr,1,0,WARN,_cVar14,(size_t)&local_2f8,0x31
            );
  boost::detail::shared_count::~shared_count(&sStack_270);
  WalletDescriptor::~WalletDescriptor(&wallet_descriptor);
  std::__cxx11::string::~string((string *)&logHelper);
  if (local_230.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_230.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  pCVar7 = (CWallet *)operator_new(0x4a8);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wallet_descriptor,"",(allocator<char> *)&desc);
  local_300 = local_220;
  local_220 = (WalletDatabase *)0x0;
  CWallet::CWallet(pCVar7,pCVar1,(string *)&wallet_descriptor,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_300);
  std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<wallet::CWallet,void>
            ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&logHelper,pCVar7);
  if (local_300 != (WalletDatabase *)0x0) {
    (*local_300->_vptr_WalletDatabase[1])();
  }
  local_300 = (WalletDatabase *)0x0;
  std::__cxx11::string::~string((string *)&wallet_descriptor);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x37;
  file_01.m_begin = (iterator)&local_310;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_320,
             msg_01);
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011480b0;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_328 = "";
  DVar6 = CWallet::LoadWallet((CWallet *)logHelper.m_message._M_dataplus._M_p);
  desc._M_dataplus._M_p._0_4_ = DVar6;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,6);
  pcVar13 = "DBErrors::UNKNOWN_DESCRIPTOR";
  next_index = 0xc998b0;
  uVar11 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
            (&wallet_descriptor,&local_330,0x37);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&logHelper.m_message._M_string_length);
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8._M_impl.super__Rb_tree_header._M_header;
  local_1a8._M_impl._0_8_ = 0;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_00._M_t._M_impl._4_4_ = uVar11;
  records_00._M_t._M_impl._0_4_ = next_index;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = assertion_descr;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pcVar13;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffbf0;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc00;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records_00);
  peVar3 = wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pWVar2 = local_220;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_220 = (WalletDatabase *)peVar3;
  if (pWVar2 != (WalletDatabase *)0x0) {
    (**(code **)(*(long *)pWVar2 + 8))();
    if (wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*(wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_Descriptor[1])();
    }
  }
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_1a8);
  found = false;
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"The descriptor ID calculated by the wallet differs from the one in DB",
             (allocator<char> *)&wallet_descriptor);
  local_358._8_8_ = 0;
  local_358._M_unused._M_object = &found;
  local_340 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp:65:103)>
              ::_M_invoke;
  local_348 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp:65:103)>
              ::_M_manager;
  message._M_dataplus._M_p._4_4_ = uVar11;
  message._M_dataplus._M_p._0_4_ = next_index;
  message._M_string_length = (size_type)assertion_descr;
  message.field_2._M_allocated_capacity = (size_type)pcVar13;
  message.field_2._8_8_ = in_stack_fffffffffffffbf0;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc00;
  match.super__Function_base._M_functor._M_unused._M_object = this;
  match.super__Function_base._M_manager = in_stack_fffffffffffffc08;
  match._M_invoker = in_stack_fffffffffffffc10;
  DebugLogHelper::DebugLogHelper(&logHelper,message,match);
  std::_Function_base::~_Function_base((_Function_base *)&local_358);
  std::__cxx11::string::~string(local_218);
  pWVar2 = local_220;
  (*local_220->_vptr_WalletDatabase[0xe])(&local_230,local_220,0);
  local_230.m_database = pWVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&desc,
             "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu"
             ,(allocator<char> *)&wallet_descriptor);
  std::make_shared<wallet::walletload_tests::DummyDescriptor,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wallet_1);
  local_368 = wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_360._M_pi =
       wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pvVar8 = (iterator)0x0;
  pvVar9 = (iterator)0x0;
  descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_368;
  WalletDescriptor::WalletDescriptor(&wallet_descriptor,descriptor_00,0,0,0,next_index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_360);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4b;
  file_02.m_begin = (iterator)&local_378;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_388,
             msg_02);
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       WalletBatch::WriteDescriptor(&local_230,&uint256::ONE,&wallet_descriptor);
  local_280 = (char *)CONCAT71(local_280._1_7_,
                               rVar5.super_readonly_property<bool>.super_class_property<bool>.value)
  ;
  local_278 = (element_type *)0x0;
  sStack_270.pi_ = (sp_counted_base *)0x0;
  local_2b8 = "batch.WriteDescriptor(uint256::ONE, wallet_descriptor)";
  local_2b0 = "";
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011481f0;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_390 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_280,(lazy_ostream *)&wallet_1,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_398,0x4b);
  boost::detail::shared_count::~shared_count(&sStack_270);
  WalletDescriptor::~WalletDescriptor(&wallet_descriptor);
  std::__cxx11::string::~string((string *)&desc);
  if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_230.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_230.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  pCVar7 = (CWallet *)operator_new(0x4a8);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wallet_descriptor,"",(allocator<char> *)&desc);
  local_3a0 = local_220;
  local_220 = (WalletDatabase *)0x0;
  CWallet::CWallet(pCVar7,pCVar1,(string *)&wallet_descriptor,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_3a0);
  std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<wallet::CWallet,void>
            ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&wallet_1,pCVar7);
  if (local_3a0 != (WalletDatabase *)0x0) {
    (*local_3a0->_vptr_WalletDatabase[1])();
  }
  local_3a0 = (WalletDatabase *)0x0;
  std::__cxx11::string::~string((string *)&wallet_descriptor);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_3b0;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c0,
             msg_03);
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011480b0;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_3c8 = "";
  DVar6 = CWallet::LoadWallet(wallet_1.
                              super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             );
  psVar10 = &desc;
  desc._M_dataplus._M_p._0_4_ = DVar6;
  local_280 = (char *)CONCAT44(local_280._4_4_,9);
  pvVar8 = (iterator)0x2;
  paVar12 = (assertion_result *)&local_280;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
            (&wallet_descriptor,&local_3d0,0x51,1,2,psVar10,0xc998b0,(assertion_result *)&local_280,
             "DBErrors::CORRUPT");
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_3d8 = "";
  file_04.m_end = (iterator)0x52;
  file_04.m_begin = (iterator)&local_3e0;
  msg_04.m_end = (iterator)psVar10;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
             (size_t)&stack0xfffffffffffffc10,msg_04);
  desc._M_dataplus._M_p._0_1_ = found;
  desc._M_string_length = 0;
  desc.field_2._M_allocated_capacity = 0;
  local_280 = "found";
  local_278 = (element_type *)0xcea99b;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_011481f0;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ = (assertion_result *)&local_280;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&desc,(lazy_ostream *)&wallet_descriptor,1,0,WARN,
             (check_type)paVar12,(size_t)&stack0xfffffffffffffc00,0x52);
  boost::detail::shared_count::~shared_count((shared_count *)&desc.field_2._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  DebugLogHelper::~DebugLogHelper(&logHelper);
  if (local_220 != (WalletDatabase *)0x0) {
    (**(code **)(*(long *)local_220 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_load_descriptors, TestingSetup)
{
    std::unique_ptr<WalletDatabase> database = CreateMockableWalletDatabase();
    {
        // Write unknown active descriptor
        WalletBatch batch(*database, false);
        std::string unknown_desc = "trx(tpubD6NzVbkrYhZ4Y4S7m6Y5s9GD8FqEMBy56AGphZXuagajudVZEnYyBahZMgHNCTJc2at82YX6s8JiL1Lohu5A3v1Ur76qguNH4QVQ7qYrBQx/86'/1'/0'/0/*)#8pn8tzdt";
        WalletDescriptor wallet_descriptor(std::make_shared<DummyDescriptor>(unknown_desc), 0, 0, 0, 0);
        BOOST_CHECK(batch.WriteDescriptor(uint256(), wallet_descriptor));
        BOOST_CHECK(batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(OutputType::UNKNOWN), uint256(), false));
    }

    {
        // Now try to load the wallet and verify the error.
        const std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(database)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::UNKNOWN_DESCRIPTOR);
    }

    // Test 2
    // Now write a valid descriptor with an invalid ID.
    // As the software produces another ID for the descriptor, the loading process must be aborted.
    database = CreateMockableWalletDatabase();

    // Verify the error
    bool found = false;
    DebugLogHelper logHelper("The descriptor ID calculated by the wallet differs from the one in DB", [&](const std::string* s) {
        found = true;
        return false;
    });

    {
        // Write valid descriptor with invalid ID
        WalletBatch batch(*database, false);
        std::string desc = "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu";
        WalletDescriptor wallet_descriptor(std::make_shared<DummyDescriptor>(desc), 0, 0, 0, 0);
        BOOST_CHECK(batch.WriteDescriptor(uint256::ONE, wallet_descriptor));
    }

    {
        // Now try to load the wallet and verify the error.
        const std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(database)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
        BOOST_CHECK(found); // The error must be logged
    }
}